

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionarySGL.hpp
# Opt level: O1

uint32_t __thiscall
ddd::DictionarySGL<false,_true>::search_key(DictionarySGL<false,_true> *this,char *key)

{
  bool bVar1;
  uint32_t uVar2;
  Query agent;
  Query local_18;
  
  local_18.pos_ = 0;
  local_18.value_ = 0x7fffffff;
  local_18.node_pos_ = 0;
  local_18.is_finished_ = false;
  local_18.key_ = key;
  bVar1 = DaTrie<false,_true,_false>::search_key
                    ((this->trie_)._M_t.
                     super___uniq_ptr_impl<ddd::DaTrie<false,_true,_false>,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_ddd::DaTrie<false,_true,_false>_*,_std::default_delete<ddd::DaTrie<false,_true,_false>_>_>
                     .super__Head_base<0UL,_ddd::DaTrie<false,_true,_false>_*,_false>._M_head_impl,
                     &local_18);
  uVar2 = 0xffffffff;
  if (bVar1) {
    uVar2 = local_18.value_;
  }
  return uVar2;
}

Assistant:

uint32_t search_key(const char* key) const {
    Query agent(key);
    if (!trie_->search_key(agent)) {
      return NOT_FOUND;
    }
    return agent.value();
  }